

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.c
# Opt level: O1

axbStatus_t axbMatGetNonzerosSize(axbMat_s *mat,size_t *num_nonzeros)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  
  if (mat->storage_type == AXB_STORAGE_DENSE) {
    if (mat->rows == 0) {
      sVar2 = 0;
    }
    else {
      sVar1 = mat->cols;
      lVar4 = 0;
      sVar2 = 0;
      sVar5 = 0;
      do {
        if (sVar1 != 0) {
          sVar3 = 0;
          do {
            sVar2 = sVar2 + (*(double *)((long)mat->values + sVar3 * 8 + lVar4) != 0.0);
            sVar3 = sVar3 + 1;
          } while (sVar1 != sVar3);
        }
        sVar5 = sVar5 + 1;
        lVar4 = lVar4 + sVar1 * 8;
      } while (sVar5 != mat->rows);
    }
  }
  else {
    sVar2 = mat->nonzeros;
  }
  *num_nonzeros = sVar2;
  return 0;
}

Assistant:

axbStatus_t axbMatGetNonzerosSize(const struct axbMat_s *mat, size_t *num_nonzeros)
{
  if (mat->storage_type == AXB_STORAGE_DENSE) { // count the number of actual nonzeros
    size_t nnz = 0;
    for (size_t i=0; i<mat->rows; ++i)
      for (size_t j=0; j<mat->cols; ++j) {
        double val = ((double*)mat->values)[i*mat->cols + j];
        if (val < 0 || val > 0) ++nnz;
      }
    *num_nonzeros = nnz;
  } else {
    *num_nonzeros = mat->nonzeros;
  }
  return 0;
}